

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

unique_ptr<Expression,_std::default_delete<Expression>_> __thiscall
Parser::parseNumberExpression(Parser *this)

{
  NumericConstant *pNVar1;
  CalculationEngine *this_00;
  Parser *in_RSI;
  NumericConstant local_50;
  NumericConstant value;
  
  pNVar1 = Token::numericValue(&in_RSI->mCurrentToken);
  NumericConstant::NumericConstant(&value,pNVar1);
  nextToken(in_RSI);
  this_00 = (CalculationEngine *)operator_new(0x28);
  NumericConstant::NumericConstant(&local_50,&value);
  NumberExpression::NumberExpression((NumberExpression *)this_00,&local_50);
  this->mCalcEngine = this_00;
  std::_Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>::~_Vector_base
            ((_Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_> *)&local_50);
  std::_Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>::~_Vector_base
            ((_Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_> *)&value);
  return (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)
         (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expression> Parser::parseNumberExpression() {
	auto value = mCurrentToken.numericValue();
	nextToken(); //Consume the number
	return std::unique_ptr<NumberExpression>(new NumberExpression(value));
}